

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O1

void __thiscall vkb::DeviceBuilder::DeviceBuilder(DeviceBuilder *this,PhysicalDevice *phys_device)

{
  VkPhysicalDevice *__s;
  bool bVar1;
  undefined2 uVar2;
  Suitable SVar3;
  
  (this->physical_device).name._M_dataplus._M_p = (pointer)&(this->physical_device).name.field_2;
  (this->physical_device).name._M_string_length = 0;
  (this->physical_device).name.field_2._M_local_buf[0] = '\0';
  __s = &(this->physical_device).physical_device;
  memset(__s,0,0xec);
  memset(&(this->physical_device).properties,0,0x124);
  memset(&(this->physical_device).properties.limits,0,0x20c);
  memset(&(this->physical_device).memory_properties,0,0x208);
  (this->physical_device).instance_version = 0x400000;
  *(undefined8 *)&(this->physical_device).suitable = 0;
  (this->physical_device).extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->physical_device).extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->physical_device).extensions_to_enable.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->physical_device).available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->physical_device).available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->physical_device).available_extensions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->physical_device).queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->physical_device).queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->physical_device).queue_families.
  super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->physical_device).extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->physical_device).extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->physical_device).extended_features_chain.nodes.
  super__Vector_base<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->physical_device).defer_surface_initialization = false;
  (this->physical_device).properties2_ext_enabled = false;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).pNext_chain.
  super__Vector_base<VkBaseOutStructure_*,_std::allocator<VkBaseOutStructure_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->info).queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->info).queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->info).allocation_callbacks = (VkAllocationCallbacks *)0x0;
  std::__cxx11::string::operator=((string *)this,(string *)phys_device);
  memcpy(__s,&phys_device->physical_device,0x634);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&(this->physical_device).extensions_to_enable,&phys_device->extensions_to_enable)
  ;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&(this->physical_device).available_extensions,&phys_device->available_extensions)
  ;
  std::vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>::_M_move_assign
            (&(this->physical_device).queue_families,&phys_device->queue_families);
  std::
  vector<vkb::detail::GenericFeaturesPNextNode,_std::allocator<vkb::detail::GenericFeaturesPNextNode>_>
  ::_M_move_assign(&(this->physical_device).extended_features_chain.nodes,
                   &phys_device->extended_features_chain);
  bVar1 = phys_device->properties2_ext_enabled;
  uVar2 = *(undefined2 *)&phys_device->field_0x6ba;
  SVar3 = phys_device->suitable;
  (this->physical_device).defer_surface_initialization = phys_device->defer_surface_initialization;
  (this->physical_device).properties2_ext_enabled = bVar1;
  *(undefined2 *)&(this->physical_device).field_0x6ba = uVar2;
  (this->physical_device).suitable = SVar3;
  return;
}

Assistant:

DeviceBuilder::DeviceBuilder(PhysicalDevice phys_device) { physical_device = std::move(phys_device); }